

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>,duckdb::date_t,duckdb::MedianAbsoluteDeviationOperation<duckdb::timestamp_t>>
               (date_t *idata,AggregateInputData *aggr_input_data,
               QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> **states,
               ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *pQVar3;
  iterator iVar4;
  ulong uVar5;
  date_t *pdVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  date_t local_5c;
  date_t local_58;
  date_t local_54;
  ValidityMask *local_50;
  ulong local_48;
  date_t *local_40;
  date_t *local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar8 = 0;
      do {
        pQVar3 = states[iVar8];
        local_54.days = idata[iVar8].days;
        iVar4._M_current =
             (((_Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)&pQVar3->v)->_M_impl
             ).super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (((_Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)&pQVar3->v)->_M_impl)
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>::
          _M_realloc_insert<duckdb::date_t>
                    ((vector<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)pQVar3,iVar4,
                     &local_54);
        }
        else {
          (iVar4._M_current)->days = local_54.days;
          (((_Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)&pQVar3->v)->_M_impl).
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    uVar7 = 0;
    uVar10 = 0;
    local_50 = mask;
    local_40 = idata;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar11 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar11 = count;
        }
LAB_00544bc3:
        uVar5 = uVar10;
        if (uVar10 < uVar11) {
          do {
            pQVar3 = states[uVar10];
            local_5c.days = idata[uVar10].days;
            iVar4._M_current =
                 (((_Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)&pQVar3->v)->
                 _M_impl).super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (((_Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)&pQVar3->v)->
                _M_impl).super__Vector_impl_data._M_end_of_storage) {
              std::vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>::
              _M_realloc_insert<duckdb::date_t>
                        ((vector<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)pQVar3,iVar4,
                         &local_5c);
            }
            else {
              (iVar4._M_current)->days = local_5c.days;
              (((_Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)&pQVar3->v)->
              _M_impl).super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            uVar10 = uVar10 + 1;
            uVar5 = uVar11;
          } while (uVar11 != uVar10);
        }
      }
      else {
        uVar2 = puVar1[uVar7];
        uVar11 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar11 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_00544bc3;
        uVar5 = uVar11;
        if ((uVar2 != 0) && (mask = local_50, uVar5 = uVar10, uVar10 < uVar11)) {
          pdVar6 = idata + uVar10;
          uVar9 = 0;
          local_38 = pdVar6;
          do {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              pQVar3 = states[uVar10 + uVar9];
              local_58.days = pdVar6[uVar9].days;
              iVar4._M_current =
                   (((_Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)&pQVar3->v)->
                   _M_impl).super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (((_Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)&pQVar3->v)->
                  _M_impl).super__Vector_impl_data._M_end_of_storage) {
                std::vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>::
                _M_realloc_insert<duckdb::date_t>
                          ((vector<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)pQVar3,iVar4,
                           &local_58);
                pdVar6 = local_38;
                idata = local_40;
              }
              else {
                (iVar4._M_current)->days = local_58.days;
                (((_Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_> *)&pQVar3->v)->
                _M_impl).super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
            }
            uVar9 = uVar9 + 1;
            mask = local_50;
            uVar5 = uVar11;
          } while (uVar11 - uVar10 != uVar9);
        }
      }
      uVar10 = uVar5;
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_48);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}